

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall
ipx::Basis::TableauRow(Basis *this,Int jb,IndexedVector *btran,IndexedVector *row,bool ignore_fixed)

{
  int *piVar1;
  int iVar2;
  Model *pMVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  double *pdVar8;
  pointer piVar9;
  pointer piVar10;
  double *pdVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  Int p;
  double dVar21;
  
  iVar14 = this->model_->num_rows_;
  iVar2 = this->model_->num_cols_;
  SolveForUpdate(this,jb,btran);
  bVar12 = IndexedVector::sparse(btran);
  pMVar3 = this->model_;
  if (bVar12) {
    piVar4 = (btran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    uVar15 = (ulong)(uint)btran->nnz_;
    if (btran->nnz_ < 1) {
      uVar15 = uVar16;
    }
    iVar13 = 0;
    for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      lVar19 = (long)piVar4[uVar16];
      piVar5 = (pMVar3->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13 = (iVar13 + piVar5[lVar19 + 1]) - piVar5[lVar19];
    }
    if ((double)(iVar13 / 2) <= (double)iVar2 * 0.1) {
      piVar5 = (pMVar3->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (pMVar3->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      IndexedVector::set_to_zero(row);
      piVar7 = (row->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (btran->elements_)._M_data;
      lVar19 = 0;
      uVar15 = 0;
      while( true ) {
        iVar14 = (int)uVar15;
        if (btran->nnz_ <= lVar19) break;
        lVar17 = (long)piVar4[lVar19];
        dVar21 = pdVar8[lVar17];
        piVar9 = (pMVar3->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = piVar9[lVar17 + 1];
        piVar10 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (row->elements_)._M_data;
        for (lVar17 = (long)piVar9[lVar17]; lVar17 < iVar14; lVar17 = lVar17 + 1) {
          iVar2 = piVar5[lVar17];
          iVar13 = piVar10[iVar2];
          if (iVar13 == -1 || iVar13 == -2 && !ignore_fixed) {
            piVar10[iVar2] = iVar13 + -2;
            iVar13 = (int)uVar15;
            uVar15 = (ulong)(iVar13 + 1);
            piVar7[iVar13] = iVar2;
            iVar13 = piVar10[iVar2];
          }
          if (iVar13 < -2) {
            pdVar11[iVar2] = pdVar6[lVar17] * dVar21 + pdVar11[iVar2];
          }
        }
        lVar19 = lVar19 + 1;
      }
      piVar4 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = 0;
      uVar16 = 0;
      if (0 < iVar14) {
        uVar16 = uVar15;
      }
      for (; uVar16 != uVar20; uVar20 = uVar20 + 1) {
        piVar1 = piVar4 + piVar7[uVar20];
        *piVar1 = *piVar1 + 2;
      }
      goto LAB_00372011;
    }
  }
  piVar4 = (pMVar3->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pMVar3->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar18 = iVar2 + iVar14;
  piVar5 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (row->elements_)._M_data;
  uVar16 = 0;
  uVar15 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar15 = uVar16;
  }
  iVar14 = -1;
  for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
    iVar2 = piVar5[uVar16];
    dVar21 = 0.0;
    if (iVar2 == -1 || iVar2 == -2 && !ignore_fixed) {
      piVar7 = (pMVar3->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar19 = (long)piVar7[uVar16]; lVar19 < piVar7[uVar16 + 1]; lVar19 = lVar19 + 1) {
        dVar21 = dVar21 + pdVar6[lVar19] * (btran->elements_)._M_data[piVar4[lVar19]];
      }
    }
    pdVar8[uVar16] = dVar21;
  }
LAB_00372011:
  row->nnz_ = iVar14;
  return;
}

Assistant:

void Basis::TableauRow(Int jb, IndexedVector& btran, IndexedVector& row,
                       bool ignore_fixed) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    assert(IsBasic(jb));
    SolveForUpdate(jb, btran);

    // Estimate if tableau row is sparse.
    bool is_sparse = btran.sparse();
    if (is_sparse) {
        const SparseMatrix& AIt = model_.AIt();
        const Int* bi = btran.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            nz += AIt.end(i) - AIt.begin(i);
        }
        nz /= 2;                // guess for overlap
        if (nz > kHypersparseThreshold*n)
            is_sparse = false;
    }

    if (is_sparse) {
        // sparse vector * sparse matrix: accesses A rowwise
        const SparseMatrix& AIt = model_.AIt();
        const Int* Ati = AIt.rowidx();
        const double* Atx = AIt.values();
        const Int* bi = btran.pattern();
        row.set_to_zero();
        Int* row_pattern = row.pattern();
        Int nz = 0;
        for (Int k = 0; k < btran.nnz(); k++) {
            Int i = bi[k];
            double temp = btran[i];
            Int begin = AIt.begin(i);
            Int end = AIt.end(i);
            for (Int p = begin; p < end; p++) {
                Int j = Ati[p];
                if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed))
                {
                    map2basis_[j] -= 2; // mark column
                    row_pattern[nz++] = j;
                }
                if (map2basis_[j] < -2) // marked column
                    row[j] += temp * Atx[p];
            }
        }
        for (Int k = 0; k < nz; k++) // reset marked
            map2basis_[row_pattern[k]] += 2;
        row.set_nnz(nz);
    } else {
        // dense vector * sparse matrix: accesses A columnwise
        const SparseMatrix& AI = model_.AI();
        const Int* Ai = AI.rowidx();
        const double* Ax = AI.values();
        for (Int j = 0; j < n+m; j++) {
            double result = 0.0;
            if (map2basis_[j] == -1 || (map2basis_[j] == -2 && !ignore_fixed)) {
                Int begin = AI.begin(j);
                Int end = AI.end(j);
                for (Int p = begin; p < end; p++)
                    result += Ax[p] * btran[Ai[p]];
            }
            row[j] = result;
        }
        row.InvalidatePattern();
    }
}